

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_render_mode(Application *this)

{
  Application *this_local;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 1) {
    DynamicScene::Scene::triangulateSelection(this->scene);
    set_up_pathtracer(this);
    PathTracer::stop(this->pathtracer);
    PathTracer::start_raytracing(this->pathtracer);
    *(undefined4 *)&(this->super_Renderer).field_0xc = 1;
    setGhosted(this,false);
  }
  return;
}

Assistant:

void Application::to_render_mode() {
  if (mode == RENDER_MODE) return;
  scene->triangulateSelection();
  set_up_pathtracer();
  pathtracer->stop();
  pathtracer->start_raytracing();
  mode = RENDER_MODE;
  setGhosted(false);
}